

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O1

int main(int ac,char **av)

{
  char **__args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *pppcVar2;
  char *pcVar3;
  size_type sVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char **__args_00;
  uv_loop_t *loop;
  size_t sVar11;
  ostream *poVar12;
  bool bVar13;
  char *pcVar14;
  int iVar15;
  string *psVar16;
  cmake *this;
  bool clean;
  ulong uVar17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool local_4d0;
  int local_4cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string dir;
  string config;
  allocator_type local_45a;
  allocator<char> local_459;
  unsigned_long numJobs;
  undefined8 uStack_450;
  undefined1 local_448 [24];
  char **local_430;
  string dir_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nativeOptions;
  CommandLineArguments args;
  cmake cm;
  
  cmsys::Encoding::CommandLineArguments::Main(&args,ac,av);
  uVar6 = cmsys::Encoding::CommandLineArguments::argc(&args);
  __args_00 = cmsys::Encoding::CommandLineArguments::argv(&args);
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(*__args_00);
  if ((int)uVar6 < 2) {
LAB_001428e9:
    uVar6 = do_cmake(uVar6,__args_00);
    cmDynamicLoader::FlushCache();
    loop = uv_default_loop();
    uv_loop_close(loop);
    goto LAB_00143a80;
  }
  pcVar3 = __args_00[1];
  iVar7 = strcmp(pcVar3,"--build");
  local_430 = __args_00;
  if (iVar7 == 0) {
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    config._M_dataplus._M_p = (pointer)&config.field_2;
    config.field_2._M_allocated_capacity._0_4_ = 0x75626544;
    config.field_2._M_allocated_capacity._4_2_ = 0x67;
    config._M_string_length = 5;
    dir._M_dataplus._M_p = (pointer)&dir.field_2;
    dir._M_string_length = 0;
    dir.field_2._M_allocated_capacity = dir.field_2._M_allocated_capacity & 0xffffffffffffff00;
    nativeOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    nativeOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    nativeOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4d0 = cmsys::SystemTools::HasEnv("VERBOSE");
    dir_1._M_dataplus._M_p._0_4_ = 2;
    if (uVar6 == 2) {
      local_4cc = -1;
      clean = false;
    }
    else {
      iVar10 = 2;
      local_4cc = -1;
      bVar13 = false;
      iVar7 = 1;
      bVar5 = false;
      clean = false;
      do {
        __args = __args_00 + iVar10;
        if (iVar7 == 4) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &nativeOptions,__args);
          iVar8 = 4;
          goto LAB_00142e59;
        }
        pcVar3 = *__args;
        iVar8 = strncmp(pcVar3,"-j",2);
        if (iVar8 == 0) {
          if (iVar10 + 1 < (int)uVar6) {
            pcVar14 = __args_00[iVar10 + 1];
          }
          else {
            pcVar14 = (char *)0x0;
          }
          local_4cc = anon_unknown.dwarf_d6ae::extract_job_number((int *)&dir_1,pcVar3,pcVar14,2);
LAB_00142c58:
          iVar8 = 0;
          if (local_4cc < 0) {
            dir._M_string_length = 0;
            *dir._M_dataplus._M_p = '\0';
          }
        }
        else {
          iVar8 = strncmp(pcVar3,"--parallel",10);
          if (iVar8 == 0) {
            if (iVar10 + 1 < (int)uVar6) {
              pcVar14 = __args_00[iVar10 + 1];
            }
            else {
              pcVar14 = (char *)0x0;
            }
            local_4cc = anon_unknown.dwarf_d6ae::extract_job_number((int *)&dir_1,pcVar3,pcVar14,10)
            ;
            goto LAB_00142c58;
          }
          iVar9 = strcmp(pcVar3,"--target");
          iVar8 = 2;
          if ((iVar9 != 0) && (iVar9 = strcmp(pcVar3,"-t"), iVar9 != 0)) {
            iVar8 = strcmp(pcVar3,"--config");
            if (iVar8 == 0) {
              iVar8 = 3;
            }
            else {
              iVar9 = strcmp(pcVar3,"--clean-first");
              iVar15 = 0;
              iVar8 = iVar15;
              if (iVar9 == 0) {
                clean = true;
              }
              else {
                iVar9 = strcmp(pcVar3,"--verbose");
                if ((iVar9 == 0) || (iVar9 = strcmp(pcVar3,"-v"), iVar9 == 0)) {
                  local_4d0 = true;
                }
                else {
                  iVar9 = strcmp(pcVar3,"--use-stderr");
                  iVar8 = iVar7;
                  if (iVar9 != 0) {
                    iVar9 = strcmp(pcVar3,"--");
                    sVar4 = config._M_string_length;
                    if (iVar9 == 0) {
                      iVar8 = 4;
                    }
                    else if (iVar7 == 3) {
                      strlen(pcVar3);
                      std::__cxx11::string::_M_replace((ulong)&config,0,(char *)sVar4,(ulong)pcVar3)
                      ;
                      iVar8 = 0;
                    }
                    else if (iVar7 == 2) {
                      if (*pcVar3 == '\0') {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"Warning: Argument number ",0x19);
                        poVar12 = (ostream *)std::ostream::operator<<(&std::cerr,iVar10);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12," after --target option is empty.",0x20);
                        std::endl<char,std::char_traits<char>>(poVar12);
                      }
                      else {
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<char_const*const&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&targets,__args);
                        iVar7 = strcmp(*__args,"clean");
                        if (iVar7 == 0) {
                          bVar5 = true;
                        }
                        else {
                          bVar13 = true;
                        }
                      }
                      if ((bVar5) && (bVar13)) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   "Error: Building \'clean\' and other targets together is not supported."
                                   ,0x44);
                        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                        goto LAB_00142e45;
                      }
                    }
                    else if (iVar7 == 1) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&numJobs,pcVar3,(allocator<char> *)&__str);
                      cmsys::SystemTools::CollapseFullPath((string *)&cm,(string *)&numJobs);
                      std::__cxx11::string::operator=((string *)&dir,(string *)&cm);
                      if (cm.Generators.
                          super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (pointer)&cm.Generators.
                                    super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(cm.Generators.
                                        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)cm.Generators.
                                              super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1
                                       );
                      }
                      iVar8 = iVar15;
                      if ((undefined1 *)numJobs != local_448) {
                        operator_delete((void *)numJobs,(ulong)(local_448._0_8_ + 1));
                      }
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Unknown argument ",0x11);
                      pcVar3 = *__args;
                      if (pcVar3 == (char *)0x0) {
                        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x615338);
                      }
                      else {
                        sVar11 = strlen(pcVar3);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,pcVar3,sVar11);
                      }
                      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
                      std::ostream::put('8');
                      std::ostream::flush();
LAB_00142e45:
                      dir._M_string_length = 0;
                      *dir._M_dataplus._M_p = '\0';
                    }
                  }
                }
              }
            }
          }
        }
LAB_00142e59:
        iVar7 = iVar8;
        iVar10 = (int)dir_1._M_dataplus._M_p + 1;
        dir_1._M_dataplus._M_p._0_4_ = iVar10;
        __args_00 = local_430;
      } while (iVar10 < (int)uVar6);
    }
    if (local_4cc == -1) {
      pppcVar2 = &cm.Generators.
                  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)cm.Generators.
                            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)pppcVar2;
      bVar5 = cmsys::SystemTools::GetEnv("CMAKE_BUILD_PARALLEL_LEVEL",(string *)&cm);
      local_4cc = -1;
      if (bVar5) {
        if (cm.Generators.
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
          local_4cc = 0;
        }
        else {
          numJobs = 0;
          bVar5 = cmSystemTools::StringToULong
                            ((char *)cm.Generators.
                                     super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start,&numJobs);
          if (bVar5) {
            local_4cc = (int)numJobs;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"\'CMAKE_BUILD_PARALLEL_LEVEL\' environment variable\n"
                       ,0x32);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"invalid number \'",0x10);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 (char *)cm.Generators.
                                         super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                 (long)cm.Generators.
                                       super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\' given.\n\n",10);
            dir._M_string_length = 0;
            *dir._M_dataplus._M_p = '\0';
            local_4cc = -1;
          }
        }
      }
      if (cm.Generators.
          super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar2) {
        operator_delete(cm.Generators.
                        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)cm.Generators.
                              super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
    }
    if (dir._M_string_length == 0) {
      uVar6 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Usage: cmake --build <dir> [options] [-- [native-options]]\nOptions:\n  <dir>          = Project binary directory to be built.\n  --parallel [<jobs>], -j [<jobs>]\n                 = Build in parallel using the given number of jobs. \n                   If <jobs> is omitted the native build tool\'s \n                   default number is used.\n                   The CMAKE_BUILD_PARALLEL_LEVEL environment variable\n                   specifies a default parallel level when this option\n                   is not given.\n  --target <tgt>..., -t <tgt>... \n                 = Build <tgt> instead of default targets.\n  --config <cfg> = For multi-configuration tools, choose <cfg>.\n  --clean-first  = Build target \'clean\' first, then build.\n                   (To clean only, use --target \'clean\'.)\n --verbose, -v   = Enable verbose output - if supported - including\n                   the build commands to be executed. \n  --             = Pass remaining options to the native tool.\n"
                 ,0x3cc);
    }
    else {
      cmake::cmake(&cm,RoleInternal,Project);
      uStack_450 = 0;
      local_448._8_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:531:5)>
           ::_M_invoke;
      local_448._0_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:531:5)>
           ::_M_manager;
      numJobs = (unsigned_long)&cm;
      cmSystemTools::SetMessageCallback((MessageCallback *)&numJobs);
      if ((code *)local_448._0_8_ != (code *)0x0) {
        (*(code *)local_448._0_8_)(&numJobs,&numJobs,3);
      }
      dir_1._M_string_length = 0;
      dir_1.field_2._8_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:534:26)>
           ::_M_invoke;
      dir_1.field_2._M_allocated_capacity =
           (size_type)
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:534:26)>
           ::_M_manager;
      dir_1._M_dataplus._M_p = (pointer)&cm;
      cmake::SetProgressCallback(&cm,(ProgressCallbackType *)&dir_1);
      if (dir_1.field_2._M_allocated_capacity != 0) {
        (*(code *)dir_1.field_2._M_allocated_capacity)(&dir_1,&dir_1,3);
      }
      uVar6 = cmake::Build(&cm,local_4cc,&dir,&targets,&config,&nativeOptions,clean,local_4d0);
      cmake::~cmake(&cm);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&nativeOptions);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dir._M_dataplus._M_p != &dir.field_2) {
      operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)config._M_dataplus._M_p != &config.field_2) {
      operator_delete(config._M_dataplus._M_p,
                      CONCAT26(config.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(config.field_2._M_allocated_capacity._4_2_,
                                        config.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    this = (cmake *)&targets;
LAB_00143a7b:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
  }
  else {
    iVar7 = strcmp(pcVar3,"--install");
    if (iVar7 == 0) {
      config._M_dataplus._M_p = (pointer)&config.field_2;
      config._M_string_length = 0;
      config.field_2._M_allocated_capacity._0_4_ =
           config.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      dir._M_dataplus._M_p = (pointer)&dir.field_2;
      dir._M_string_length = 0;
      dir.field_2._M_allocated_capacity = dir.field_2._M_allocated_capacity & 0xffffffffffffff00;
      numJobs = (unsigned_long)local_448;
      uStack_450 = 0;
      local_448._0_8_ = local_448._0_8_ & 0xffffffffffffff00;
      dir_1._M_dataplus._M_p = (pointer)&dir_1.field_2;
      dir_1._M_string_length = 0;
      dir_1.field_2._M_allocated_capacity = dir_1.field_2._M_allocated_capacity & 0xffffffffffffff00
      ;
      local_4cc._0_1_ = cmsys::SystemTools::HasEnv("VERBOSE");
      if (uVar6 == 2) {
        bVar5 = false;
      }
      else {
        iVar7 = 1;
        uVar17 = 2;
        bVar5 = false;
        do {
          pcVar3 = local_430[uVar17];
          iVar10 = strcmp(pcVar3,"--config");
          if (iVar10 == 0) {
            iVar7 = 2;
          }
          else {
            iVar10 = strcmp(pcVar3,"--component");
            if (iVar10 == 0) {
              iVar7 = 3;
            }
            else {
              iVar10 = strcmp(pcVar3,"--prefix");
              if (iVar10 == 0) {
                iVar7 = 4;
              }
              else {
                iVar10 = strcmp(pcVar3,"--strip");
                iVar8 = 0;
                if (iVar10 == 0) {
                  bVar5 = true;
                  iVar7 = iVar8;
                }
                else {
                  iVar10 = strcmp(pcVar3,"--verbose");
                  if ((iVar10 == 0) || (iVar10 = strcmp(pcVar3,"-v"), iVar10 == 0)) {
                    local_4cc._0_1_ = true;
                    iVar7 = 0;
                  }
                  else if (iVar7 - 1U < 4) {
                    psVar16 = &config;
                    switch(iVar7) {
                    case 1:
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&targets,pcVar3,(allocator<char> *)&nativeOptions);
                      cmsys::SystemTools::CollapseFullPath((string *)&cm,(string *)&targets);
                      std::__cxx11::string::operator=((string *)&dir_1,(string *)&cm);
                      if (cm.Generators.
                          super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (pointer)&cm.Generators.
                                    super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(cm.Generators.
                                        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)cm.Generators.
                                              super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1
                                       );
                      }
                      iVar7 = iVar8;
                      if (targets.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (pointer)&targets.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(targets.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (ulong)((long)&((targets.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + 1));
                      }
                      goto LAB_001433df;
                    case 3:
                      psVar16 = &dir;
                      break;
                    case 4:
                      psVar16 = (string *)&numJobs;
                    }
                    pcVar14 = (char *)psVar16->_M_string_length;
                    strlen(pcVar3);
                    std::__cxx11::string::_M_replace((ulong)psVar16,0,pcVar14,(ulong)pcVar3);
                    iVar7 = 0;
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Unknown argument ",0x11);
                    pcVar3 = local_430[uVar17];
                    if (pcVar3 == (char *)0x0) {
                      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x615338);
                    }
                    else {
                      sVar11 = strlen(pcVar3);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,pcVar3,sVar11);
                    }
                    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
                    std::ostream::put('8');
                    std::ostream::flush();
                    dir_1._M_string_length = 0;
                    *dir_1._M_dataplus._M_p = '\0';
                  }
                }
              }
            }
          }
LAB_001433df:
          uVar17 = uVar17 + 1;
          __args_00 = local_430;
        } while (uVar6 != uVar17);
      }
      if (dir_1._M_string_length == 0) {
        uVar6 = 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Usage: cmake --install <dir> [options]\nOptions:\n  <dir>              = Project binary directory to install.\n  --config <cfg>     = For multi-configuration tools, choose <cfg>.\n  --component <comp> = Component-based install. Only install <comp>.\n  --prefix <prefix>  = The installation prefix CMAKE_INSTALL_PREFIX.\n  --strip            = Performing install/strip.\n  -v --verbose       = Enable verbose output.\n"
                   ,0x199);
      }
      else {
        cmake::cmake(&cm,RoleScript,Script);
        targets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        targets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:617:5)>
                      ::_M_manager;
        targets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&cm;
        cmSystemTools::SetMessageCallback((MessageCallback *)&targets);
        if (targets.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          (*(code *)targets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)(&targets,&targets,3);
        }
        nativeOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        nativeOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:620:26)>
                      ::_M_manager;
        nativeOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&cm;
        cmake::SetProgressCallback(&cm,(ProgressCallbackType *)&nativeOptions);
        if (nativeOptions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          (*(code *)nativeOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)
                    (&nativeOptions,&nativeOptions,3);
        }
        paVar1 = &__str.field_2;
        __str._M_string_length = 0;
        __str.field_2._M_local_buf[0] = '\0';
        __str._M_dataplus._M_p = (pointer)paVar1;
        cmake::SetHomeDirectory(&cm,&__str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,
                          CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                   __str.field_2._M_local_buf[0]) + 1);
        }
        __str._M_string_length = 0;
        __str.field_2._M_local_buf[0] = '\0';
        __str._M_dataplus._M_p = (pointer)paVar1;
        cmake::SetHomeOutputDirectory(&cm,&__str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,
                          CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                   __str.field_2._M_local_buf[0]) + 1);
        }
        cm.DebugOutput = local_4cc._0_1_;
        cm.CurrentWorkingMode = SCRIPT_MODE;
        std::__cxx11::string::string<std::allocator<char>>((string *)&__str,*__args_00,&local_459);
        __l._M_len = 1;
        __l._M_array = &__str;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&args_1,__l,&local_45a);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,
                          CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                   __str.field_2._M_local_buf[0]) + 1);
        }
        if (uStack_450 != 0) {
          std::operator+(&__str,"-DCMAKE_INSTALL_PREFIX=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &numJobs);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                     &__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != paVar1) {
            operator_delete(__str._M_dataplus._M_p,
                            CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                     __str.field_2._M_local_buf[0]) + 1);
          }
        }
        if (dir._M_string_length != 0) {
          std::operator+(&__str,"-DCMAKE_INSTALL_COMPONENT=",&dir);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                     &__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != paVar1) {
            operator_delete(__str._M_dataplus._M_p,
                            CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                     __str.field_2._M_local_buf[0]) + 1);
          }
        }
        if (bVar5) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[27]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                     (char (*) [27])"-DCMAKE_INSTALL_DO_STRIP=1");
        }
        if (config._M_string_length != 0) {
          std::operator+(&__str,"-DCMAKE_INSTALL_CONFIG_NAME=",&config);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                     &__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != paVar1) {
            operator_delete(__str._M_dataplus._M_p,
                            CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                     __str.field_2._M_local_buf[0]) + 1);
          }
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                   (char (*) [3])0x4ae217);
        __str._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__str,dir_1._M_dataplus._M_p,
                   dir_1._M_dataplus._M_p + dir_1._M_string_length);
        std::__cxx11::string::append((char *)&__str);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                   &__str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,
                          CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                   __str.field_2._M_local_buf[0]) + 1);
        }
        iVar7 = cmake::Run(&cm,&args_1,false);
        uVar6 = (uint)(iVar7 != 0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&args_1);
        cmake::~cmake(&cm);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dir_1._M_dataplus._M_p != &dir_1.field_2) {
        operator_delete(dir_1._M_dataplus._M_p,dir_1.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)numJobs != local_448) {
        operator_delete((void *)numJobs,(ulong)(local_448._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dir._M_dataplus._M_p != &dir.field_2) {
        operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)config._M_dataplus._M_p == &config.field_2) goto LAB_00143a80;
    }
    else {
      iVar7 = strcmp(pcVar3,"--open");
      if (iVar7 != 0) {
        iVar7 = strcmp(pcVar3,"-E");
        if (iVar7 != 0) goto LAB_001428e9;
        cm.Generators.
        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        cm.Generators.
        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        cm.Generators.
        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cm,(ulong)(uVar6 - 1));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cm,
                   __args_00);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<char_const*const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cm,
                   cm.Generators.
                   super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args_00 + 2,__args_00 + uVar6);
        uVar6 = cmcmd::ExecuteCMakeCommand
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&cm);
        this = &cm;
        goto LAB_00143a7b;
      }
      config._M_dataplus._M_p = (pointer)&config.field_2;
      config._M_string_length = 0;
      config.field_2._M_allocated_capacity._0_4_ =
           config.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      if (uVar6 != 2) {
        bVar5 = true;
        uVar17 = 2;
        do {
          if (bVar5) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&dir,local_430[uVar17],(allocator<char> *)&numJobs);
            cmsys::SystemTools::CollapseFullPath((string *)&cm,&dir);
            std::__cxx11::string::operator=((string *)&config,(string *)&cm);
            if (cm.Generators.
                super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pointer)&cm.Generators.
                          super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(cm.Generators.
                              super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)cm.Generators.
                                    super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)dir._M_dataplus._M_p != &dir.field_2) {
              operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Unknown argument ",0x11);
            pcVar3 = local_430[uVar17];
            if (pcVar3 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x615338);
            }
            else {
              sVar11 = strlen(pcVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,pcVar3,sVar11);
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
            std::ostream::put('8');
            std::ostream::flush();
            config._M_string_length = 0;
            *config._M_dataplus._M_p = '\0';
          }
          uVar17 = uVar17 + 1;
          bVar5 = false;
        } while (uVar6 != uVar17);
      }
      if (config._M_string_length == 0) {
        uVar6 = 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Usage: cmake --open <dir>\n",0x1a);
      }
      else {
        cmake::cmake(&cm,RoleInternal,Unknown);
        dir._M_string_length = 0;
        dir.field_2._8_8_ =
             std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:686:5)>
             ::_M_invoke;
        dir.field_2._M_allocated_capacity =
             (size_type)
             std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:686:5)>
             ::_M_manager;
        dir._M_dataplus._M_p = (pointer)&cm;
        cmSystemTools::SetMessageCallback((MessageCallback *)&dir);
        if (dir.field_2._M_allocated_capacity != 0) {
          (*(code *)dir.field_2._M_allocated_capacity)(&dir,&dir,3);
        }
        uStack_450 = 0;
        local_448._8_8_ =
             std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:689:26)>
             ::_M_invoke;
        local_448._0_8_ =
             std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:689:26)>
             ::_M_manager;
        numJobs = (unsigned_long)&cm;
        cmake::SetProgressCallback(&cm,(ProgressCallbackType *)&numJobs);
        if ((code *)local_448._0_8_ != (code *)0x0) {
          (*(code *)local_448._0_8_)(&numJobs,&numJobs,3);
        }
        bVar5 = cmake::Open(&cm,&config,false);
        uVar6 = (uint)!bVar5;
        cmake::~cmake(&cm);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)config._M_dataplus._M_p == &config.field_2) goto LAB_00143a80;
    }
    operator_delete(config._M_dataplus._M_p,
                    CONCAT26(config.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(config.field_2._M_allocated_capacity._4_2_,
                                      config.field_2._M_allocated_capacity._0_4_)) + 1);
  }
LAB_00143a80:
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&args);
  return uVar6;
}

Assistant:

int main(int ac, char const* const* av)
{
#if defined(_WIN32) && defined(CMAKE_BUILD_WITH_CMAKE)
  // Replace streambuf so we can output Unicode to console
  cmsys::ConsoleBuf::Manager consoleOut(std::cout);
  consoleOut.SetUTF8Pipes();
  cmsys::ConsoleBuf::Manager consoleErr(std::cerr, true);
  consoleErr.SetUTF8Pipes();
#endif
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  ac = args.argc();
  av = args.argv();

  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(av[0]);
  if (ac > 1) {
    if (strcmp(av[1], "--build") == 0) {
      return do_build(ac, av);
    }
    if (strcmp(av[1], "--install") == 0) {
      return do_install(ac, av);
    }
    if (strcmp(av[1], "--open") == 0) {
      return do_open(ac, av);
    }
    if (strcmp(av[1], "-E") == 0) {
      return do_command(ac, av);
    }
  }
  int ret = do_cmake(ac, av);
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDynamicLoader::FlushCache();
#endif
  uv_loop_close(uv_default_loop());
  return ret;
}